

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O3

void __thiscall capnp::TwoPartyVatNetwork::receiveIncomingMessage(TwoPartyVatNetwork *this)

{
  receiveIncomingMessage(this);
  return;
}

Assistant:

kj::Promise<kj::Maybe<kj::Own<IncomingRpcMessage>>> TwoPartyVatNetwork::receiveIncomingMessage() {
  return kj::evalLater([this]() -> kj::Promise<kj::Maybe<kj::Own<IncomingRpcMessage>>> {
    KJ_IF_SOME(e, readCancelReason) {
      // A previous write failed; propagate the failure to reads, too.
      return kj::cp(e);
    }

    kj::Array<kj::OwnFd> fdSpace = nullptr;
    if(maxFdsPerMessage > 0) {
      fdSpace = kj::heapArray<kj::OwnFd>(maxFdsPerMessage);
    }
    auto promise = readCanceler.wrap(getStream().tryReadMessage(fdSpace, receiveOptions));
    return promise.then([fdSpace = kj::mv(fdSpace)]
                        (kj::Maybe<MessageReaderAndFds>&& messageAndFds) mutable
                      -> kj::Maybe<kj::Own<IncomingRpcMessage>> {
      KJ_IF_SOME(m, messageAndFds) {
        if (m.fds.size() > 0) {
          return kj::Own<IncomingRpcMessage>(
              kj::heap<IncomingMessageImpl>(kj::mv(m), kj::mv(fdSpace)));
        } else {
          return kj::Own<IncomingRpcMessage>(kj::heap<IncomingMessageImpl>(kj::mv(m.reader)));
        }
      } else {
        return kj::none;
      }
    });
  });
}